

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O0

SQObjectPtr * __thiscall SQObjectPtr::operator=(SQObjectPtr *this,SQObjectPtr *obj)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  SQTable *pSVar3;
  SQUnsignedInteger SVar4;
  SQObjectType *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectValue unOldVal;
  SQObjectType tOldType;
  
  SVar1 = (in_RDI->super_SQObject)._type;
  pSVar2 = (in_RDI->super_SQObject)._unVal.pTable;
  (in_RDI->super_SQObject)._unVal = *(SQObjectValue *)(in_RSI + 2);
  (in_RDI->super_SQObject)._type = *in_RSI;
  if (((in_RDI->super_SQObject)._type & 0x8000000) != 0) {
    pSVar3 = (in_RDI->super_SQObject)._unVal.pTable;
    (pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
         (pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef + 1;
  }
  if ((SVar1 & 0x8000000) != 0) {
    SVar4 = (pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
    (pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = SVar4;
    if (SVar4 == 0) {
      (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return in_RDI;
}

Assistant:

inline SQObjectPtr& operator=(const SQObjectPtr& obj)
    {
        SQObjectType tOldType;
        SQObjectValue unOldVal;
        tOldType=_type;
        unOldVal=_unVal;
        _unVal = obj._unVal;
        _type = obj._type;
        __AddRef(_type,_unVal);
        __Release(tOldType,unOldVal);
        return *this;
    }